

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::anon_unknown_1::CoordFragmentShader::shadeFragments
          (CoordFragmentShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  FragmentPacket *packet_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Vector<float,_4> local_f8;
  Vector<float,_4> local_e8;
  Vector<float,_4> local_d8;
  Vector<float,_4> local_c8;
  undefined1 local_b8 [8];
  Vec4 color3;
  Vec4 color2;
  Vec4 color1;
  Vec4 color0;
  Vec4 vtxColor3;
  Vec4 vtxColor2;
  Vec4 vtxColor1;
  Vec4 vtxColor0;
  FragmentPacket *packet;
  int packetNdx;
  FragmentShadingContext *context_local;
  int numPackets_local;
  FragmentPacket *packets_local;
  CoordFragmentShader *this_local;
  
  for (packet._4_4_ = 0; packet._4_4_ < numPackets; packet._4_4_ = packet._4_4_ + 1) {
    packet_00 = packets + packet._4_4_;
    rr::readVarying<float>((rr *)(vtxColor1.m_data + 2),packet_00,context,0,0);
    rr::readVarying<float>((rr *)(vtxColor2.m_data + 2),packet_00,context,0,1);
    rr::readVarying<float>((rr *)(vtxColor3.m_data + 2),packet_00,context,0,2);
    rr::readVarying<float>((rr *)(color0.m_data + 2),packet_00,context,0,3);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(color1.m_data + 2),(Vector<float,_4> *)(vtxColor1.m_data + 2));
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(color2.m_data + 2),(Vector<float,_4> *)(vtxColor2.m_data + 2));
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(color3.m_data + 2),(Vector<float,_4> *)(vtxColor3.m_data + 2));
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)local_b8,(Vector<float,_4> *)(color0.m_data + 2));
    fVar1 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(color1.m_data + 2));
    fVar2 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(color1.m_data + 2));
    fVar3 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(color1.m_data + 2));
    fVar4 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(color1.m_data + 2));
    fVar5 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(color1.m_data + 2));
    fVar6 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(color1.m_data + 2));
    tcu::Vector<float,_4>::Vector(&local_c8,fVar1 * fVar2,fVar3 * fVar4,fVar5 * fVar6,1.0);
    rr::writeFragmentOutput<tcu::Vector<float,4>>(context,packet._4_4_,0,0,&local_c8);
    fVar1 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(color2.m_data + 2));
    fVar2 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(color2.m_data + 2));
    fVar3 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(color2.m_data + 2));
    fVar4 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(color2.m_data + 2));
    fVar5 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(color2.m_data + 2));
    fVar6 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(color2.m_data + 2));
    tcu::Vector<float,_4>::Vector(&local_d8,fVar1 * fVar2,fVar3 * fVar4,fVar5 * fVar6,1.0);
    rr::writeFragmentOutput<tcu::Vector<float,4>>(context,packet._4_4_,1,0,&local_d8);
    fVar1 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(color3.m_data + 2));
    fVar2 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(color3.m_data + 2));
    fVar3 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(color3.m_data + 2));
    fVar4 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(color3.m_data + 2));
    fVar5 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(color3.m_data + 2));
    fVar6 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(color3.m_data + 2));
    tcu::Vector<float,_4>::Vector(&local_e8,fVar1 * fVar2,fVar3 * fVar4,fVar5 * fVar6,1.0);
    rr::writeFragmentOutput<tcu::Vector<float,4>>(context,packet._4_4_,2,0,&local_e8);
    fVar1 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_b8);
    fVar2 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_b8);
    fVar3 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_b8);
    fVar4 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_b8);
    fVar5 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_b8);
    fVar6 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_b8);
    tcu::Vector<float,_4>::Vector(&local_f8,fVar1 * fVar2,fVar3 * fVar4,fVar5 * fVar6,1.0);
    rr::writeFragmentOutput<tcu::Vector<float,4>>(context,packet._4_4_,3,0,&local_f8);
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; packetNdx++)
		{
			rr::FragmentPacket&	packet		= packets[packetNdx];

			const tcu::Vec4		vtxColor0	= rr::readVarying<float>(packet, context, 0, 0);
			const tcu::Vec4		vtxColor1	= rr::readVarying<float>(packet, context, 0, 1);
			const tcu::Vec4		vtxColor2	= rr::readVarying<float>(packet, context, 0, 2);
			const tcu::Vec4		vtxColor3	= rr::readVarying<float>(packet, context, 0, 3);

			const tcu::Vec4		color0		= vtxColor0;
			const tcu::Vec4		color1		= vtxColor1;
			const tcu::Vec4		color2		= vtxColor2;
			const tcu::Vec4		color3		= vtxColor3;

			rr::writeFragmentOutput(context, packetNdx, 0, 0, tcu::Vec4(color0.x() * color0.w(), color0.y() * color0.w(), color0.z() * color0.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 1, 0, tcu::Vec4(color1.x() * color1.w(), color1.y() * color1.w(), color1.z() * color1.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 2, 0, tcu::Vec4(color2.x() * color2.w(), color2.y() * color2.w(), color2.z() * color2.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 3, 0, tcu::Vec4(color3.x() * color3.w(), color3.y() * color3.w(), color3.z() * color3.w(), 1.0f));
		}
	}